

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CGL::GLScene::Mesh::draw_halfedge_arrow(Mesh *this,Halfedge *h)

{
  _List_node_base _Var1;
  _List_node_base _Var2;
  _List_node_base _Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  __m128d adVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Vector3D c;
  Vector3D b;
  Vector3D a;
  
  uVar13 = (ulong)((Halfedge *)(this->hoveredFeature).element == h) << 3 | 0xa0;
  if ((Halfedge *)(this->selectedFeature).element == h) {
    uVar13 = 0xb0;
  }
  DrawStyle::style_halfedge
            (*(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + uVar13));
  p_Var4 = (h->_next)._M_node;
  p_Var5 = (h->_vertex)._M_node;
  _Var1 = p_Var5[2];
  p_Var5 = p_Var5[3]._M_next;
  p_Var6 = p_Var4[2]._M_prev;
  _Var2 = p_Var6[2];
  p_Var6 = p_Var6[3]._M_next;
  p_Var4 = p_Var4[2]._M_next[2]._M_prev;
  _Var3 = p_Var4[2];
  p_Var4 = p_Var4[3]._M_next;
  auVar10 = vsubpd_avx((undefined1  [16])_Var2,(undefined1  [16])_Var1);
  auVar19 = vsubpd_avx((undefined1  [16])_Var3,(undefined1  [16])_Var2);
  auVar11 = vsubpd_avx((undefined1  [16])_Var1,(undefined1  [16])_Var3);
  auVar11 = vsubpd_avx(auVar10,auVar11);
  auVar10 = vsubpd_avx(auVar19,auVar10);
  a.field_0._0_8_ = (double)_Var1._M_next + auVar11._0_8_ * 0.5 * 0.2;
  a.field_0._8_8_ = (double)_Var1._M_prev + auVar11._8_8_ * 0.5 * 0.2;
  a.field_0.field_0.z =
       (double)p_Var5 +
       (((double)p_Var6 - (double)p_Var5) - ((double)p_Var5 - (double)p_Var4)) * 0.5 * 0.2;
  adVar15[0] = (double)_Var2._M_next + auVar10._0_8_ * 0.5 * 0.2;
  adVar15[1] = (double)_Var2._M_prev + auVar10._8_8_ * 0.5 * 0.2;
  dVar7 = (double)p_Var6 +
          (((double)p_Var4 - (double)p_Var6) - ((double)p_Var6 - (double)p_Var5)) * 0.5 * 0.2;
  auVar19 = vsubpd_avx((undefined1  [16])adVar15,(undefined1  [16])a.field_0.field_2.__vec);
  dVar12 = dVar7 - a.field_0.field_0.z;
  auVar10 = vshufpd_avx(auVar19,auVar19,1);
  dVar8 = auVar10._0_8_ * 0.2;
  b.field_0.field_2.__vec = (__m128d)(undefined1  [16])adVar15;
  b.field_0.field_0.z = dVar7;
  Face::normal(&c,(Face *)((h->_face)._M_node + 1));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = c.field_0.field_0.x;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar8;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar12;
  auVar10 = vunpcklpd_avx(auVar10,auVar19);
  auVar17._0_8_ = auVar10._0_8_ * 0.2;
  auVar17._8_8_ = auVar10._8_8_ * 0.2;
  auVar19._8_8_ = c.field_0.field_0.z;
  auVar19._0_8_ = c.field_0._16_8_;
  auVar10 = vunpcklpd_avx(auVar19,auVar14);
  auVar19 = vunpcklpd_avx(auVar11,auVar17);
  auVar20._0_8_ = auVar19._0_8_ * auVar10._0_8_;
  auVar20._8_8_ = auVar19._8_8_ * auVar10._8_8_;
  auVar21._0_8_ = c.field_0.field_0.y * auVar17._0_8_;
  auVar21._8_8_ = c.field_0.field_0.z * auVar17._8_8_;
  auVar19 = vsubpd_avx(auVar21,auVar20);
  auVar10 = vshufpd_avx(auVar17,auVar17,1);
  dVar12 = auVar10._0_8_ * c.field_0.field_0.y;
  dVar9 = c.field_0.field_0.x * dVar8;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar8 * -0.8660254037844387;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar10._0_8_ * -0.8660254037844387;
  auVar10 = vunpcklpd_avx(auVar18,auVar16);
  c.field_0.field_0.x = auVar10._0_8_ + adVar15[0] + auVar19._0_8_ * 0.49999999999999994;
  c.field_0.field_0.y = auVar10._8_8_ + adVar15[1] + auVar19._8_8_ * 0.49999999999999994;
  c.field_0.field_0.z =
       (dVar9 - dVar12) * 0.49999999999999994 + auVar17._0_8_ * -0.8660254037844387 + dVar7;
  glBegin(3);
  glVertex3dv(&a);
  glVertex3dv(&b);
  glVertex3dv(&c);
  glEnd();
  uVar13 = (ulong)((Halfedge *)(this->hoveredFeature).element == h) << 3 | 0xa0;
  if ((Halfedge *)(this->selectedFeature).element == h) {
    uVar13 = 0xb0;
  }
  DrawStyle::style_reset
            (*(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + uVar13));
  return;
}

Assistant:

void Mesh::draw_halfedge_arrow(const Halfedge *h) const {
  get_draw_style(h)->style_halfedge();

  const Vector3D p0 = h->vertex()->position;
  const Vector3D p1 = h->next()->vertex()->position;
  const Vector3D p2 = h->next()->next()->vertex()->position;

  const Vector3D e01 = p1-p0;
  const Vector3D e12 = p2-p1;
  const Vector3D e20 = p0-p2;

  const Vector3D u = (e01 - e20) / 2;
  const Vector3D v = (e12 - e01) / 2;

  const Vector3D a = p0 + u / 5;
  const Vector3D b = p1 + v / 5;

  const Vector3D s = (b-a) / 5;
  const Vector3D t = cross(h->face()->normal(), s);
  double theta = PI * 5 / 6;
  const Vector3D c = b + cos(theta) * s + sin(theta) * t;

  glBegin(GL_LINE_STRIP);
  glVertex3dv(&a.x);
  glVertex3dv(&b.x);
  glVertex3dv(&c.x);
  glEnd();

  get_draw_style(h)->style_reset();
}